

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeMemSetDouble(Mem *pMem,double val)

{
  int iVar1;
  
  sqlite3VdbeMemSetNull(pMem);
  iVar1 = sqlite3IsNaN(val);
  if (iVar1 == 0) {
    (pMem->u).r = val;
    pMem->flags = 8;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemSetDouble(Mem *pMem, double val){
  sqlite3VdbeMemSetNull(pMem);
  if( !sqlite3IsNaN(val) ){
    pMem->u.r = val;
    pMem->flags = MEM_Real;
  }
}